

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStairFlightType::~IfcStairFlightType(IfcStairFlightType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  
  this_00 = (IfcTypeProduct *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
  pvVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlightType,_1UL>).field_0x20
           + *(long *)(*(long *)this + -0x18);
  *(undefined8 *)((long)pvVar1 + -0x1b0) = 0x834bb8;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x834cd0;
  *(undefined8 *)((long)pvVar1 + -0x128) = 0x834be0;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x834c08;
  *(undefined8 *)((long)pvVar1 + -0xc0) = 0x834c30;
  *(undefined8 *)((long)pvVar1 + -0x68) = 0x834c58;
  *(undefined8 *)((long)pvVar1 + -0x30) = 0x834c80;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x834ca8;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x834f98;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x60 = 0x835060;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x834fc0;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x834fe8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x835010;
  *(undefined8 *)&this_00->field_0x148 = 0x835038;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__00834cf8);
  return;
}

Assistant:

IfcStairFlightType() : Object("IfcStairFlightType") {}